

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O2

int AF_AStateProvider_A_CustomPunch
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  byte *pbVar1;
  int iVar2;
  DObject *this;
  void *pvVar3;
  AWeapon *this_00;
  bool bVar4;
  int iVar5;
  int max;
  PClassActor *pufftype;
  PClass *p;
  AInventory *this_01;
  int iVar6;
  FSoundID *sound_id;
  AActor *t1;
  uint uVar7;
  char *pcVar8;
  int damage;
  void *pvVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  PClassInventory *local_b8;
  int actualdamage;
  PClass *local_98;
  DObject *pDStack_90;
  AActor *local_88;
  FSoundID local_80;
  FSoundID local_7c;
  FSoundID local_78;
  FName local_74;
  FTranslatedLineTarget t;
  DAngle local_50;
  DAngle local_48;
  double local_40;
  AActor *local_38;
  
  if (numparam < 1) {
LAB_003de97b:
    pcVar8 = "(paramnum) < numparam";
    goto LAB_003de9c9;
  }
  if ((param->field_0).field_3.Type == '\x03') {
    t1 = *(AActor **)&param->field_0;
    if ((param->field_0).field_1.atag == 1) {
      if (t1 == (AActor *)0x0) {
LAB_003de30a:
        t1 = (AActor *)0x0;
      }
      else {
        bVar4 = DObject::IsKindOf((DObject *)t1,AActor::RegistrationInfo.MyClass);
        if (!bVar4) {
          pcVar8 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_003de9c9;
        }
      }
      if (numparam == 1) goto LAB_003de97b;
      if (param[1].field_0.field_3.Type == '\x03') {
        this = (DObject *)param[1].field_0.field_1.a;
        if (param[1].field_0.field_1.atag == 1) {
          if ((this != (DObject *)0x0) &&
             (bVar4 = DObject::IsKindOf(this,AStateProvider::RegistrationInfo.MyClass), !bVar4)) {
            pcVar8 = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AStateProvider))";
            goto LAB_003de9c9;
          }
        }
        else if (this != (DObject *)0x0) goto LAB_003de972;
        if ((uint)numparam < 3) goto LAB_003de97b;
        if (param[2].field_0.field_3.Type != '\x03') {
          pcVar8 = "param[paramnum].Type == REGT_POINTER";
          goto LAB_003de9c9;
        }
        if (numparam == 3) {
          pcVar8 = "(paramnum) < numparam";
LAB_003de9f1:
          __assert_fail(pcVar8,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                        ,0x817,
                        "int AF_AStateProvider_A_CustomPunch(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        if (param[3].field_0.field_3.Type != '\0') {
          pcVar8 = "param[paramnum].Type == REGT_INT";
          goto LAB_003de9f1;
        }
        pvVar3 = param[2].field_0.field_1.a;
        damage = param[3].field_0.i;
        if ((uint)numparam < 5) {
          param = defaultparam->Array;
          if (param[4].field_0.field_3.Type != '\0') {
            pcVar8 = "(defaultparam[paramnum]).Type == REGT_INT";
            goto LAB_003deabd;
          }
          bVar4 = param[4].field_0.i == 0;
LAB_003de3c6:
          if (param[5].field_0.field_3.Type != '\0') {
            pcVar8 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003deadc:
            __assert_fail(pcVar8,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                          ,0x819,
                          "int AF_AStateProvider_A_CustomPunch(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                         );
          }
          uVar7 = param[5].field_0.i;
LAB_003de3d5:
          if (param[6].field_0.field_3.Type != '\x03') {
LAB_003de9a3:
            pcVar8 = 
            "(defaultparam[paramnum]).Type == REGT_POINTER && ((defaultparam[paramnum]).atag == ATAG_OBJECT || (defaultparam[paramnum]).a == nullptr)"
            ;
LAB_003de9aa:
            __assert_fail(pcVar8,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                          ,0x81a,
                          "int AF_AStateProvider_A_CustomPunch(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                         );
          }
          pufftype = (PClassActor *)param[6].field_0.field_1.a;
          if (param[6].field_0.field_1.atag != 1) {
            if (pufftype != (PClassActor *)0x0) goto LAB_003de9a3;
            pufftype = (PClassActor *)0x0;
          }
LAB_003de3f7:
          if (param[7].field_0.field_3.Type != '\x01') {
            pcVar8 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
LAB_003dea8c:
            __assert_fail(pcVar8,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                          ,0x81b,
                          "int AF_AStateProvider_A_CustomPunch(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                         );
          }
          uVar10 = (undefined4)*(undefined8 *)&param[7].field_0;
          uVar11 = (undefined4)((ulong)*(undefined8 *)&param[7].field_0 >> 0x20);
LAB_003de408:
          if (param[8].field_0.field_3.Type != '\x01') {
            pcVar8 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
LAB_003dea6d:
            __assert_fail(pcVar8,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                          ,0x81c,
                          "int AF_AStateProvider_A_CustomPunch(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                         );
          }
          pvVar9 = param[8].field_0.field_1.a;
LAB_003de41f:
          if (param[9].field_0.field_3.Type != '\0') {
            pcVar8 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003dea4e:
            __assert_fail(pcVar8,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                          ,0x81d,
                          "int AF_AStateProvider_A_CustomPunch(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                         );
          }
          max = param[9].field_0.i;
LAB_003de434:
          if (param[10].field_0.field_3.Type != '\x03') {
LAB_003de984:
            pcVar8 = 
            "(defaultparam[paramnum]).Type == REGT_POINTER && ((defaultparam[paramnum]).atag == ATAG_OBJECT || (defaultparam[paramnum]).a == nullptr)"
            ;
LAB_003de98b:
            __assert_fail(pcVar8,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                          ,0x81e,
                          "int AF_AStateProvider_A_CustomPunch(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                         );
          }
          local_b8 = (PClassInventory *)param[10].field_0.field_1.a;
          if (param[10].field_0.field_1.atag != 1) {
            if (local_b8 != (PClassInventory *)0x0) goto LAB_003de984;
            local_b8 = (PClassInventory *)0x0;
          }
LAB_003de45f:
          if (param[0xb].field_0.field_3.Type != '\0') {
            pcVar8 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003dea2f:
            __assert_fail(pcVar8,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                          ,0x81f,
                          "int AF_AStateProvider_A_CustomPunch(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                         );
          }
          iVar6 = param[0xb].field_0.i;
LAB_003de474:
          if (param[0xc].field_0.field_3.Type != '\0') {
            pcVar8 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003dea10:
            __assert_fail(pcVar8,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                          ,0x820,
                          "int AF_AStateProvider_A_CustomPunch(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                         );
          }
        }
        else {
          if (param[4].field_0.field_3.Type != '\0') {
            pcVar8 = "(param[paramnum]).Type == REGT_INT";
LAB_003deabd:
            __assert_fail(pcVar8,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                          ,0x818,
                          "int AF_AStateProvider_A_CustomPunch(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                         );
          }
          bVar4 = param[4].field_0.i == 0;
          if (numparam == 5) {
            param = defaultparam->Array;
            goto LAB_003de3c6;
          }
          if (param[5].field_0.field_3.Type != '\0') {
            pcVar8 = "(param[paramnum]).Type == REGT_INT";
            goto LAB_003deadc;
          }
          uVar7 = param[5].field_0.i;
          if ((uint)numparam < 7) {
            param = defaultparam->Array;
            goto LAB_003de3d5;
          }
          if ((param[6].field_0.field_3.Type != '\x03') ||
             (pufftype = (PClassActor *)param[6].field_0.field_1.a,
             pufftype != (PClassActor *)0x0 && param[6].field_0.field_1.atag != 1)) {
            pcVar8 = 
            "(param[paramnum]).Type == REGT_POINTER && ((param[paramnum]).atag == ATAG_OBJECT || (param[paramnum]).a == nullptr)"
            ;
            goto LAB_003de9aa;
          }
          if (numparam == 7) {
            param = defaultparam->Array;
            goto LAB_003de3f7;
          }
          if (param[7].field_0.field_3.Type != '\x01') {
            pcVar8 = "(param[paramnum]).Type == REGT_FLOAT";
            goto LAB_003dea8c;
          }
          uVar10 = (undefined4)*(undefined8 *)&param[7].field_0;
          uVar11 = (undefined4)((ulong)*(undefined8 *)&param[7].field_0 >> 0x20);
          if ((uint)numparam < 9) {
            param = defaultparam->Array;
            goto LAB_003de408;
          }
          if (param[8].field_0.field_3.Type != '\x01') {
            pcVar8 = "(param[paramnum]).Type == REGT_FLOAT";
            goto LAB_003dea6d;
          }
          pvVar9 = (void *)param[8].field_0.f;
          if (numparam == 9) {
            param = defaultparam->Array;
            goto LAB_003de41f;
          }
          if (param[9].field_0.field_3.Type != '\0') {
            pcVar8 = "(param[paramnum]).Type == REGT_INT";
            goto LAB_003dea4e;
          }
          max = param[9].field_0.i;
          if ((uint)numparam < 0xb) {
            param = defaultparam->Array;
            goto LAB_003de434;
          }
          if ((param[10].field_0.field_3.Type != '\x03') ||
             (local_b8 = (PClassInventory *)param[10].field_0.field_1.a,
             local_b8 != (PClassInventory *)0x0 && param[10].field_0.field_1.atag != 1)) {
            pcVar8 = 
            "(param[paramnum]).Type == REGT_POINTER && ((param[paramnum]).atag == ATAG_OBJECT || (param[paramnum]).a == nullptr)"
            ;
            goto LAB_003de98b;
          }
          if (numparam == 0xb) {
            param = defaultparam->Array;
            goto LAB_003de45f;
          }
          if (param[0xb].field_0.field_3.Type != '\0') {
            pcVar8 = "(param[paramnum]).Type == REGT_INT";
            goto LAB_003dea2f;
          }
          iVar6 = param[0xb].field_0.i;
          if ((uint)numparam < 0xd) {
            param = defaultparam->Array;
            goto LAB_003de474;
          }
          if (param[0xc].field_0.field_3.Type != '\0') {
            pcVar8 = "(param[paramnum]).Type == REGT_INT";
            goto LAB_003dea10;
          }
        }
        if (t1->player == (player_t *)0x0) {
          return 0;
        }
        local_98 = (PClass *)CONCAT44(uVar11,uVar10);
        pDStack_90 = (DObject *)0x0;
        iVar2 = param[0xc].field_0.i;
        this_00 = t1->player->ReadyWeapon;
        if (bVar4) {
          iVar5 = FRandom::operator()(&pr_cwpunch);
          damage = damage * (iVar5 % 8 + 1);
        }
        iVar5 = FRandom::Random2(&pr_cwpunch);
        local_88 = (AActor *)((double)iVar5 * 0.02197265625 + (t1->Angles).Yaw.Degrees);
        local_98 = (PClass *)
                   (~-(ulong)((double)local_98 == 0.0) & (ulong)local_98 |
                   -(ulong)((double)local_98 == 0.0) & 0x4050000000000000);
        local_40 = 0.0;
        local_38 = local_88;
        P_AimLineAttack((AActor *)&actualdamage,(DAngle *)t1,(double)local_98,
                        (FTranslatedLineTarget *)&local_38,(DAngle *)&t,(int)&local_40,(AActor *)0x0
                        ,(AActor *)0x0);
        if ((((((uVar7 & 1) != 0) && (t.linetarget != (AActor *)0x0)) && (this_00 != (AWeapon *)0x0)
             ) && ((pvVar3 != (void *)0x0 && t1->player != (player_t *)0x0 &&
                   (*(int *)((long)pvVar3 + 8) == 1)))) &&
           (bVar4 = AWeapon::DepleteAmmo(this_00,this_00->bAltFire,true,-1), !bVar4)) {
          return 0;
        }
        if (pufftype == (PClassActor *)0x0) {
          pufftype = PClass::FindActor(NAME_BulletPuff);
        }
        local_48.Degrees = (double)local_88;
        local_74.Index = 0x89;
        P_LineAttack(t1,&local_48,(double)local_98,&local_50,damage,&local_74,pufftype,
                     (uVar7 >> 2 & 2) + 1,&t,&actualdamage);
        if (t.linetarget == (AActor *)0x0) {
          if (iVar2 == 0) {
            return 0;
          }
          local_78.ID = iVar2;
          S_Sound(t1,1,&local_78,1.0,1.0);
          return 0;
        }
        if ((0.0 < (double)pvVar9) && ((((t.linetarget)->flags5).Value & 1) == 0)) {
          if ((uVar7 & 0x20) == 0) {
            P_GiveBody(t1,(int)((double)pvVar9 * (double)actualdamage),max);
          }
          else {
            if (local_b8 == (PClassInventory *)0x0) {
              p = PClass::FindClass("ArmorBonus");
              local_b8 = dyn_cast<PClassInventory>((DObject *)p);
              if (local_b8 == (PClassInventory *)0x0) goto LAB_003de837;
            }
            bVar4 = PClass::IsAncestorOf
                              (ABasicArmorBonus::RegistrationInfo.MyClass,(PClass *)local_b8);
            if (!bVar4) {
              __assert_fail("armorbonustype->IsDescendantOf(RUNTIME_CLASS(ABasicArmorBonus))",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                            ,0x852,
                            "int AF_AStateProvider_A_CustomPunch(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                           );
            }
            this_01 = (AInventory *)Spawn(&local_b8->super_PClassActor);
            *(int *)((long)&this_01[1].super_AActor.super_DThinker.super_DObject.ObjNext + 4) =
                 (int)((double)pvVar9 * (double)actualdamage) *
                 *(int *)((long)&this_01[1].super_AActor.super_DThinker.super_DObject.ObjNext + 4);
            if (max < 1) {
              max = *(int *)&this_01[1].super_AActor.super_DThinker.super_DObject.Class;
            }
            *(int *)&this_01[1].super_AActor.super_DThinker.super_DObject.Class = max;
            pbVar1 = (byte *)((long)&(this_01->super_AActor).flags.Value + 2);
            *pbVar1 = *pbVar1 | 2;
            AActor::ClearCounters((AActor *)this_01);
            bVar4 = AInventory::CallTryPickup(this_01,t1,(AActor **)0x0);
            if (!bVar4) {
              (*(this_01->super_AActor).super_DThinker.super_DObject._vptr_DObject[4])(this_01);
            }
          }
        }
LAB_003de837:
        if (this_00 != (AWeapon *)0x0) {
          if (iVar6 == 0) {
            iVar6 = (this_00->super_AStateProvider).super_AInventory.super_AActor.AttackSound.
                    super_FSoundID.ID;
            sound_id = &local_80;
          }
          else {
            sound_id = &local_7c;
          }
          sound_id->ID = iVar6;
          S_Sound(t1,1,sound_id,1.0,1.0);
        }
        if ((uVar7 & 0x10) == 0) {
          (t1->Angles).Yaw.Degrees = t.angleFromSource.Degrees;
        }
        if ((uVar7 & 4) != 0) {
          *(byte *)&(t1->flags).Value = (byte)(t1->flags).Value | 0x80;
        }
        if ((uVar7 & 2) != 0) {
          P_DaggerAlert(t1,t.linetarget);
        }
        return 0;
      }
    }
    else if (t1 == (AActor *)0x0) goto LAB_003de30a;
  }
LAB_003de972:
  pcVar8 = 
  "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
  ;
LAB_003de9c9:
  __assert_fail(pcVar8,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                ,0x816,
                "int AF_AStateProvider_A_CustomPunch(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
               );
}

Assistant:

DEFINE_ACTION_FUNCTION(AStateProvider, A_CustomPunch)
{
	PARAM_ACTION_PROLOGUE(AStateProvider);
	PARAM_INT		(damage);
	PARAM_BOOL_DEF	(norandom);
	PARAM_INT_DEF	(flags);
	PARAM_CLASS_DEF	(pufftype, AActor);
	PARAM_FLOAT_DEF	(range);
	PARAM_FLOAT_DEF	(lifesteal);
	PARAM_INT_DEF	(lifestealmax);
	PARAM_CLASS_DEF	(armorbonustype, ABasicArmorBonus);
	PARAM_SOUND_DEF	(MeleeSound);
	PARAM_SOUND_DEF	(MissSound);

	if (!self->player)
		return 0;

	player_t *player = self->player;
	AWeapon *weapon = player->ReadyWeapon;


	DAngle angle;
	DAngle pitch;
	FTranslatedLineTarget t;
	int			actualdamage;

	if (!norandom)
		damage *= pr_cwpunch() % 8 + 1;

	angle = self->Angles.Yaw + pr_cwpunch.Random2() * (5.625 / 256);
	if (range == 0) range = DEFMELEERANGE;
	pitch = P_AimLineAttack (self, angle, range, &t);

	// only use ammo when actually hitting something!
	if ((flags & CPF_USEAMMO) && t.linetarget && weapon && ACTION_CALL_FROM_PSPRITE())
	{
		if (!weapon->DepleteAmmo(weapon->bAltFire, true))
			return 0;	// out of ammo
	}

	if (pufftype == NULL)
		pufftype = PClass::FindActor(NAME_BulletPuff);
	int puffFlags = LAF_ISMELEEATTACK | ((flags & CPF_NORANDOMPUFFZ) ? LAF_NORANDOMPUFFZ : 0);

	P_LineAttack (self, angle, range, pitch, damage, NAME_Melee, pufftype, puffFlags, &t, &actualdamage);

	if (!t.linetarget)
	{
		if (MissSound) S_Sound(self, CHAN_WEAPON, MissSound, 1, ATTN_NORM);
	}
	else
	{
		if (lifesteal > 0 && !(t.linetarget->flags5 & MF5_DONTDRAIN))
		{
			if (flags & CPF_STEALARMOR)
			{
				if (armorbonustype == NULL)
				{
					armorbonustype = dyn_cast<ABasicArmorBonus::MetaClass>(PClass::FindClass("ArmorBonus"));
				}
				if (armorbonustype != NULL)
				{
					assert(armorbonustype->IsDescendantOf(RUNTIME_CLASS(ABasicArmorBonus)));
					ABasicArmorBonus *armorbonus = static_cast<ABasicArmorBonus *>(Spawn(armorbonustype));
					armorbonus->SaveAmount *= int(actualdamage * lifesteal);
					armorbonus->MaxSaveAmount = lifestealmax <= 0 ? armorbonus->MaxSaveAmount : lifestealmax;
					armorbonus->flags |= MF_DROPPED;
					armorbonus->ClearCounters();

					if (!armorbonus->CallTryPickup(self))
					{
						armorbonus->Destroy ();
					}
				}
			}
			else
			{
				P_GiveBody (self, int(actualdamage * lifesteal), lifestealmax);
			}
		}
		if (weapon != NULL)
		{
			if (MeleeSound) S_Sound(self, CHAN_WEAPON, MeleeSound, 1, ATTN_NORM);
			else			S_Sound (self, CHAN_WEAPON, weapon->AttackSound, 1, ATTN_NORM);
		}

		if (!(flags & CPF_NOTURN))
		{
			// turn to face target
			self->Angles.Yaw = t.angleFromSource;
		}

		if (flags & CPF_PULLIN) self->flags |= MF_JUSTATTACKED;
		if (flags & CPF_DAGGER) P_DaggerAlert (self, t.linetarget);
	}
	return 0;
}